

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<float,_1000>::TPZManVector
          (TPZManVector<float,_1000> *this,TPZManVector<float,_1000> *copy)

{
  float *pfVar1;
  float *pfVar2;
  ulong uVar3;
  ulong uVar4;
  
  (this->super_TPZVec<float>).fStore = (float *)0x0;
  (this->super_TPZVec<float>).fNElements = 0;
  (this->super_TPZVec<float>).fNAlloc = 0;
  (this->super_TPZVec<float>)._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_017d7a00;
  uVar4 = (copy->super_TPZVec<float>).fNElements;
  if ((long)uVar4 < 0x3e9) {
    pfVar2 = this->fExtAlloc;
    uVar3 = 0;
  }
  else {
    pfVar2 = (float *)operator_new__(-(ulong)(uVar4 >> 0x3e != 0) | uVar4 * 4);
    uVar3 = uVar4;
  }
  (this->super_TPZVec<float>).fStore = pfVar2;
  (this->super_TPZVec<float>).fNElements = uVar4;
  (this->super_TPZVec<float>).fNAlloc = uVar3;
  pfVar1 = (copy->super_TPZVec<float>).fStore;
  uVar3 = 0;
  if ((long)uVar4 < 1) {
    uVar4 = uVar3;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    pfVar2[uVar3] = pfVar1[uVar3];
  }
  return;
}

Assistant:

inline TPZManVector< T, NumExtAlloc >::TPZManVector(const TPZManVector< T, NumExtAlloc >& copy) {
    const int64_t size = copy.NElements();

    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }

    for (int64_t i = 0; i < size; i++) {
        this->fStore[i] = copy.fStore[i];
    }
}